

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O2

vector<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
* build_column_matrix<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>
            (vector<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
             *__return_storage_ptr__,Column_settings *settings)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  allocator_type local_5d;
  int local_5c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  Column_settings *local_40;
  Column_z2_settings *local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  
  (__return_storage_ptr__->
  super__Vector_base<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = (Column_z2_settings *)0x100000000;
  uStack_30 = 0x500000003;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,__l,&local_5d);
  local_5c = 4;
  local_40 = settings;
  std::
  vector<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>>
  ::
  emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>,int,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>::Column_z2_settings*>
            ((vector<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>>
              *)__return_storage_ptr__,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,&local_5c,&local_40);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_58);
  local_38 = (Column_z2_settings *)0x100000000;
  uStack_30 = 0x500000002;
  local_28 = 6;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,__l_00,&local_5d);
  local_5c = 4;
  local_40 = settings;
  std::
  vector<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>>
  ::
  emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>,int,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>::Column_z2_settings*>
            ((vector<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>>
              *)__return_storage_ptr__,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,&local_5c,&local_40);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_58);
  local_38 = (Column_z2_settings *)0x100000000;
  uStack_30 = 0x500000002;
  local_28 = 6;
  __l_01._M_len = 5;
  __l_01._M_array = (iterator)&local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,__l_01,&local_5d);
  local_5c = 4;
  local_40 = settings;
  std::
  vector<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>>
  ::
  emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>,int,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>::Column_z2_settings*>
            ((vector<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>>
              *)__return_storage_ptr__,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,&local_5c,&local_40);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_58);
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = (Column_settings *)CONCAT44(local_40._4_4_,4);
  local_38 = settings;
  std::
  vector<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>>
  ::
  emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>,int,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>::Column_z2_settings*>
            ((vector<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>>
              *)__return_storage_ptr__,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,(int *)&local_40,
             &local_38);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_58);
  local_38 = (Column_z2_settings *)0x100000000;
  uStack_30 = 0x500000003;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,__l_02,&local_5d);
  local_5c = 4;
  local_40 = settings;
  std::
  vector<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>>
  ::
  emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>,int,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>::Column_z2_settings*>
            ((vector<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>>
              *)__return_storage_ptr__,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,&local_5c,&local_40);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_58);
  std::
  vector<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>>
  ::
  emplace_back<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>&>
            ((vector<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>>
              *)__return_storage_ptr__,
             (__return_storage_ptr__->
             super__Vector_base<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 1);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Column> build_column_matrix(typename Column::Column_settings& settings) {
  std::vector<Column> matrix;

  if constexpr (is_z2<Column>()) {
    using cont = std::vector<unsigned int>;

    matrix.emplace_back(cont{0, 1, 3, 5}, 4, &settings);
    matrix.emplace_back(cont{0, 1, 2, 5, 6}, 4, &settings);
    matrix.emplace_back(cont{0, 1, 2, 5, 6}, 4, &settings);
    matrix.emplace_back(cont{}, 4, &settings);
    matrix.emplace_back(cont{0, 1, 3, 5}, 4, &settings);
    matrix.emplace_back(matrix[1]);
  } else {
    using cont = std::vector<std::pair<unsigned int, typename Column::Field_element> >;
    matrix.emplace_back(cont{{0, 1}, {1, 2}, {3, 3}, {5, 4}}, 4, &settings);
    matrix.emplace_back(cont{{0, 4}, {1, 2}, {2, 1}, {5, 1}, {6, 1}}, 4, &settings);
    matrix.emplace_back(cont{{0, 1}, {1, 3}, {2, 4}, {5, 4}, {6, 4}}, 4, &settings);
    matrix.emplace_back(cont{}, 4, &settings);
    matrix.emplace_back(cont{{0, 1}, {1, 2}, {3, 3}, {5, 4}}, 4, &settings);
    matrix.emplace_back(matrix[1]);
  }

  return matrix;
}